

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void __thiscall llvm::yaml::Output::newLineCheck(Output *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  raw_ostream *this_00;
  void *pvVar4;
  ulong uVar5;
  size_t in_RCX;
  int iVar6;
  undefined1 uVar7;
  StringRef Str;
  StringRef Str_00;
  
  sVar3 = (this->Padding).Length;
  if ((sVar3 == 1) && (*(this->Padding).Data == '\n')) {
    this_00 = this->Out;
    if (this_00->OutBufEnd == this_00->OutBufCur) {
      raw_ostream::write(this_00,0xe5017f,(void *)0x1,in_RCX);
    }
    else {
      *this_00->OutBufCur = '\n';
      this_00->OutBufCur = this_00->OutBufCur + 1;
    }
    this->Column = 0;
    (this->Padding).Data = (char *)0x0;
    (this->Padding).Length = 0;
    uVar1 = (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
            super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
            super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase
            .Size;
    uVar5 = (ulong)uVar1;
    if (uVar5 != 0) {
      iVar6 = uVar1 - 1;
      pvVar4 = (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
               super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
               super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
               super_SmallVectorBase.BeginX;
      uVar2 = *(uint *)((long)pvVar4 + uVar5 * 4 + -4);
      uVar7 = true;
      if (1 < uVar2) {
        uVar7 = false;
        if (((uVar1 != 1) && (uVar7 = false, uVar2 < 7)) && ((0x5cU >> (uVar2 & 0x1f) & 1) != 0)) {
          uVar7 = *(uint *)((long)pvVar4 + uVar5 * 4 + -8) < 2;
          if ((bool)uVar7) {
            iVar6 = uVar1 - 2;
          }
        }
      }
      for (; iVar6 != 0; iVar6 = iVar6 + -1) {
        this->Column = this->Column + 2;
        Str.Length = 2;
        Str.Data = "  ";
        raw_ostream::operator<<(this->Out,Str);
      }
      if ((bool)uVar7) {
        this->Column = this->Column + 2;
        Str_00.Length = 2;
        Str_00.Data = "- ";
        raw_ostream::operator<<(this->Out,Str_00);
        return;
      }
    }
  }
  else {
    this->Column = this->Column + (int)sVar3;
    raw_ostream::operator<<(this->Out,this->Padding);
    (this->Padding).Data = (char *)0x0;
    (this->Padding).Length = 0;
  }
  return;
}

Assistant:

void Output::newLineCheck() {
  if (Padding != "\n") {
    output(Padding);
    Padding = {};
    return;
  }
  outputNewLine();
  Padding = {};

  if (StateStack.size() == 0)
    return;

  unsigned Indent = StateStack.size() - 1;
  bool OutputDash = false;

  if (StateStack.back() == inSeqFirstElement ||
      StateStack.back() == inSeqOtherElement) {
    OutputDash = true;
  } else if ((StateStack.size() > 1) &&
             ((StateStack.back() == inMapFirstKey) ||
              inFlowSeqAnyElement(StateStack.back()) ||
              (StateStack.back() == inFlowMapFirstKey)) &&
             inSeqAnyElement(StateStack[StateStack.size() - 2])) {
    --Indent;
    OutputDash = true;
  }

  for (unsigned i = 0; i < Indent; ++i) {
    output("  ");
  }
  if (OutputDash) {
    output("- ");
  }

}